

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TorsionTypeParser.cpp
# Opt level: O3

TorsionType * __thiscall
OpenMD::TorsionTypeParser::parseTypeAndPars
          (TorsionTypeParser *this,string *type,vector<double,_std::allocator<double>_> *pars)

{
  pointer pcVar1;
  TorsionType *pTVar2;
  pointer pdVar3;
  string line;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  TorsionTypeParser *local_38;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  pcVar1 = (type->_M_dataplus)._M_p;
  local_38 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar1,pcVar1 + type->_M_string_length);
  pdVar3 = (pars->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar3 != (pars->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      std::__cxx11::string::append((char *)&local_78);
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_58,vsnprintf,0x148,"%f",*pdVar3);
      std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_58._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      pdVar3 = pdVar3 + 1;
    } while (pdVar3 != (pars->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  pTVar2 = parseLine(local_38,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return pTVar2;
}

Assistant:

TorsionType* TorsionTypeParser::parseTypeAndPars(const std::string& type,
                                                   std::vector<RealType> pars) {
    std::string line(type);

    std::vector<RealType>::iterator it;
    for (it = pars.begin(); it != pars.end(); ++it) {
      line.append("\t");
      line.append(std::to_string(*it));
    }

    return parseLine(line);
  }